

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::ByteSizeLong
          (ItemSimilarityRecommender_SimilarItems *this)

{
  long lVar1;
  Rep *pRVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  void **ppvVar7;
  
  sVar6 = (size_t)(this->similaritemlist_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->similaritemlist_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  lVar1 = sVar6 * 8;
  for (lVar5 = 0; lVar1 - lVar5 != 0; lVar5 = lVar5 + 8) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>
                      (*(ItemSimilarityRecommender_ConnectedItem **)((long)ppvVar7 + lVar5));
    sVar6 = sVar6 + sVar3;
  }
  if (this->itemid_ != 0) {
    uVar4 = this->itemid_ | 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar6 = sVar6 + ((int)lVar1 * 9 + 0x89U >> 6);
  }
  sVar3 = sVar6 + 9;
  if (this->itemscoreadjustment_ == 0.0) {
    sVar3 = sVar6;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

size_t ItemSimilarityRecommender_SimilarItems::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ItemSimilarityRecommender.SimilarItems)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ItemSimilarityRecommender.ConnectedItem similarItemList = 2;
  total_size += 1UL * this->_internal_similaritemlist_size();
  for (const auto& msg : this->similaritemlist_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // uint64 itemId = 1;
  if (this->_internal_itemid() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_itemid());
  }

  // double itemScoreAdjustment = 3;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_itemscoreadjustment = this->_internal_itemscoreadjustment();
  uint64_t raw_itemscoreadjustment;
  memcpy(&raw_itemscoreadjustment, &tmp_itemscoreadjustment, sizeof(tmp_itemscoreadjustment));
  if (raw_itemscoreadjustment != 0) {
    total_size += 1 + 8;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}